

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O2

void __thiscall libtorrent::torrent_error_alert::~torrent_error_alert(torrent_error_alert *this)

{
  torrent_alert::~torrent_alert(&this->super_torrent_alert);
  operator_delete(this,0x48);
  return;
}

Assistant:

struct TORRENT_EXPORT torrent_error_alert final : torrent_alert
	{
		// internal
		TORRENT_UNEXPORT torrent_error_alert(aux::stack_allocator& alloc, torrent_handle const& h
			, error_code const& e, string_view f);

		TORRENT_DEFINE_ALERT_PRIO(torrent_error_alert, 64, alert_priority::high)

		static inline constexpr alert_category_t static_category = alert_category::error | alert_category::status;
		std::string message() const override;

		// specifies which error the torrent encountered.
		error_code const error;

		// the filename (or object) the error occurred on.
		char const* filename() const;

	private:
		aux::allocation_slot m_file_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		// the filename (or object) the error occurred on.
		TORRENT_DEPRECATED std::string error_file;
#endif

	}